

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emt.c
# Opt level: O1

void emtlst(emtcxdef *ctx,uint ofs,uchar *base)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  uchar *puVar5;
  uint16_t tmp_2;
  ushort uVar6;
  uint *puVar7;
  ulong uVar8;
  uint uVar9;
  
  uVar2 = ctx->emtcxofs;
  emtres(ctx,2);
  puVar5 = ctx->emtcxptr;
  uVar6 = ctx->emtcxofs;
  (puVar5 + uVar6)[0] = '\x02';
  (puVar5 + uVar6)[1] = '\0';
  ctx->emtcxofs = ctx->emtcxofs + 2;
  if (ofs != 0) {
    uVar6 = *(ushort *)(base + ofs);
    if (uVar6 != 0) {
      puVar7 = (uint *)(base + (ulong)uVar6 * 0x10 + (ulong)ofs);
      uVar8 = (ulong)uVar2;
      do {
        bVar1 = (byte)puVar7[-2];
        if (bVar1 < 0x40) {
          if (bVar1 != 0x36) {
            if (bVar1 == 0x37) {
              uVar8 = 1;
            }
            goto switchD_00120e6b_caseD_41;
          }
          uVar3 = *(ushort *)(base + *(long *)puVar7);
          emtres(ctx,1);
          uVar4 = ctx->emtcxofs;
          ctx->emtcxofs = uVar4 + 1;
          ctx->emtcxptr[uVar4] = '\x03';
          emtres(ctx,uVar3);
          memcpy(ctx->emtcxptr + ctx->emtcxofs,base + *(long *)puVar7,(ulong)uVar3);
          ctx->emtcxofs = ctx->emtcxofs + uVar3;
          goto LAB_00120fd7;
        }
        uVar9 = 0xd;
        switch(bVar1) {
        case 0x40:
          break;
        case 0x41:
        case 0x42:
        case 0x43:
        case 0x44:
        case 0x45:
        case 0x47:
        case 0x48:
        case 0x4a:
        case 0x4b:
          goto switchD_00120e6b_caseD_41;
        case 0x46:
          uVar9 = 10;
          break;
        case 0x49:
          uVar9 = 2;
          break;
        case 0x4c:
          emtres(ctx,1);
          uVar3 = ctx->emtcxofs;
          ctx->emtcxofs = uVar3 + 1;
          ctx->emtcxptr[uVar3] = '\a';
          emtlst(ctx,*puVar7,base);
          goto LAB_00120fd7;
        case 0x4d:
          uVar8 = 5;
          goto switchD_00120e6b_caseD_41;
        case 0x4e:
          uVar8 = 8;
switchD_00120e6b_caseD_41:
          emtres(ctx,1);
          uVar3 = ctx->emtcxofs;
          ctx->emtcxofs = uVar3 + 1;
          ctx->emtcxptr[uVar3] = (uchar)uVar8;
          if (((uchar)uVar8 != '\x05') && (((uint)uVar8 & 0xff) != 8)) {
            emtres(ctx,4);
            *(uint *)(ctx->emtcxptr + ctx->emtcxofs) = *puVar7;
            ctx->emtcxofs = ctx->emtcxofs + 4;
          }
          goto LAB_00120fd7;
        default:
          if (bVar1 != 0x55) goto switchD_00120e6b_caseD_41;
        }
        emtres(ctx,1);
        uVar3 = ctx->emtcxofs;
        ctx->emtcxofs = uVar3 + 1;
        ctx->emtcxptr[uVar3] = (uchar)uVar9;
        emtres(ctx,2);
        *(short *)(ctx->emtcxptr + ctx->emtcxofs) = (short)*puVar7;
        ctx->emtcxofs = ctx->emtcxofs + 2;
        uVar8 = (ulong)uVar9;
LAB_00120fd7:
        puVar7 = puVar7 + -4;
        uVar6 = uVar6 - 1;
      } while (uVar6 != 0);
    }
    *(ushort *)(ctx->emtcxptr + uVar2) = ctx->emtcxofs - uVar2;
  }
  return;
}

Assistant:

void emtlst(emtcxdef *ctx, uint ofs, uchar *base)
{
    uint      initofs;
    ushort    i;
    emtlidef *lst;
    emtledef *ele;
        
    initofs = ctx->emtcxofs;                        /* save starting offset */
    emtint2(ctx, 2);                             /* emit placeholder length */
    if (ofs == 0) return;              /* nothing more to do for empty list */

    lst = (emtlidef *)(base + ofs);

    for (i = lst->emtlicnt, ele = &lst->emtliele[i-1] ; i ; --ele, --i)
    {
        uchar dat;
        
        switch(ele->emtletyp)
        {
        case TOKTLIST:
            emtbyte(ctx, DAT_LIST);
            emtlst(ctx, (uint)ele->emtleval, base);
            continue;

        case TOKTSSTRING:
        {
            uint oplen = osrp2(base + ele->emtleval);
            
            emtbyte(ctx, DAT_SSTRING);
            emtmem(ctx, base + ele->emtleval, oplen);
            continue;
        }

        case TOKTNUMBER:
            dat = DAT_NUMBER;
            break;
        case TOKTNIL:
            dat = DAT_NIL;
            break;
        case TOKTTRUE:
            dat = DAT_TRUE;
            break;

        case TOKTPOUND:
            dat = DAT_PROPNUM;
            goto symbol;
        case TOKTFUNCTION:
            dat = DAT_FNADDR;
            goto symbol;
        case TOKTOBJECT:
            dat = DAT_OBJECT;
            goto symbol;
        case TOKTDOT:
            dat = DAT_PROPNUM;
            /* FALLTHROUGH */
        symbol:
            emtbyte(ctx, dat);
            emtint2(ctx, (ushort)ele->emtleval);
            continue;

        default:
            assert(FALSE);
            break;
        }
        
        /* if we get here, emit datatype in dat, plus value */
        emtbyte(ctx, dat);
        if (dat != DAT_TRUE && dat != DAT_NIL)
            emtint4(ctx, ele->emtleval);
    }
    oswp2(ctx->emtcxptr + initofs, ctx->emtcxofs - initofs);
}